

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

Move<vk::Handle<(vk::HandleType)21>_> *
vkt::api::anon_unknown_1::DescriptorPool::create
          (Move<vk::Handle<(vk::HandleType)21>_> *__return_storage_ptr__,Environment *env,
          Resources *param_2,Parameters *params)

{
  Move<vk::Handle<(vk::HandleType)21>_> *pMVar1;
  ulong uVar2;
  VkDescriptorPoolCreateInfo local_28;
  
  local_28.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
  local_28.pNext = (void *)0x0;
  local_28._16_8_ = *(undefined8 *)param_2;
  uVar2 = *(long *)(param_2 + 0x10) - (long)*(VkDescriptorPoolSize **)(param_2 + 8);
  local_28.pPoolSizes = *(VkDescriptorPoolSize **)(param_2 + 8);
  if (uVar2 == 0) {
    local_28.pPoolSizes = (VkDescriptorPoolSize *)0x0;
  }
  local_28.poolSizeCount = (deUint32)(uVar2 >> 3);
  pMVar1 = ::vk::createDescriptorPool
                     (__return_storage_ptr__,env->vkd,env->device,&local_28,env->allocationCallbacks
                     );
  return pMVar1;
}

Assistant:

static Move<VkDescriptorPool> create (const Environment& env, const Resources&, const Parameters& params)
	{
		const VkDescriptorPoolCreateInfo	descriptorPoolInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			params.flags,
			params.maxSets,
			(deUint32)params.poolSizes.size(),
			(params.poolSizes.empty() ? DE_NULL : &params.poolSizes[0])
		};

		return createDescriptorPool(env.vkd, env.device, &descriptorPoolInfo, env.allocationCallbacks);
	}